

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<double> read_real(string_view buf)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined8 uVar2;
  ptrdiff_t _Num;
  ulong __n;
  _Storage<double,_true> in_XMM0_Qa;
  optional<double> oVar3;
  string_view rhs;
  double result;
  char buffer [320];
  _Storage<double,_true> local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  __n = buf._M_len;
  if (__n < 3) {
    local_58 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    uStack_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    uStack_20 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_80 = 0;
    uStack_78 = 0;
    uStack_70 = 0;
    uStack_68 = 0;
    uStack_60 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    uStack_a8 = 0;
    uStack_a0 = 0;
    local_118 = 0;
    uStack_110 = 0;
    uStack_108 = 0;
    uStack_100 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_e0 = 0;
    local_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    if (__n != 0) goto LAB_00133401;
  }
  else {
    rhs._M_str = "inf";
    rhs._M_len = 3;
    local_160 = in_XMM0_Qa;
    bVar1 = are_equal(buf,rhs);
    if (bVar1) {
      local_160._M_value = INFINITY;
      uVar2 = CONCAT71(extraout_var,1);
      goto LAB_00133447;
    }
    if (0x140 < __n) {
      uVar2 = 0;
      goto LAB_00133447;
    }
LAB_00133401:
    uStack_20 = 0;
    uStack_28 = 0;
    uStack_30 = 0;
    uStack_38 = 0;
    uStack_40 = 0;
    uStack_48 = 0;
    uStack_50 = 0;
    local_58 = 0;
    uStack_60 = 0;
    uStack_68 = 0;
    uStack_70 = 0;
    uStack_78 = 0;
    uStack_80 = 0;
    uStack_88 = 0;
    uStack_90 = 0;
    local_98 = 0;
    uStack_a0 = 0;
    uStack_a8 = 0;
    uStack_b0 = 0;
    uStack_b8 = 0;
    uStack_c0 = 0;
    uStack_c8 = 0;
    uStack_d0 = 0;
    local_d8 = 0;
    uStack_e0 = 0;
    uStack_e8 = 0;
    uStack_f0 = 0;
    uStack_f8 = 0;
    uStack_100 = 0;
    uStack_108 = 0;
    uStack_110 = 0;
    local_118 = 0;
    uStack_120 = 0;
    uStack_128 = 0;
    uStack_130 = 0;
    uStack_138 = 0;
    uStack_140 = 0;
    uStack_148 = 0;
    uStack_150 = 0;
    local_158 = 0;
    memcpy(&local_158,buf._M_str,__n);
  }
  *(undefined1 *)((long)&local_158 + __n) = 0;
  local_160._M_value = 0.0;
  uVar2 = __isoc99_sscanf(&local_158,"%lf",&local_160);
  uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),0 < (int)uVar2);
LAB_00133447:
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar2;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = local_160._M_value;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double>
read_real(const std::string_view buf) noexcept
{
    if (buf.size() >= 3 && are_equal(buf, "inf"))
        return std::numeric_limits<double>::infinity();

    constexpr std::size_t max_digits = 320;
    if (buf.size() > max_digits)
        return std::nullopt;

    char buffer[max_digits] = { '\0' };
    std::copy_n(buf.data(), buf.size(), std::begin(buffer));
    buffer[buf.size()] = '\0';

    double result = 0;
    if (auto read = std::sscanf(buffer, "%lf", &result); read > 0)
        return result;
    else
        return std::nullopt;
}